

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_37d83::DryRunCommandRunner::StartCommand(DryRunCommandRunner *this,Edge *edge)

{
  iterator *piVar1;
  _Elt_pointer ppEVar2;
  Edge *local_8;
  
  ppEVar2 = (this->finished_).c.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
            super__Deque_impl_data._M_finish._M_cur;
  if (ppEVar2 ==
      (this->finished_).c.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_last + -1) {
    local_8 = edge;
    std::deque<Edge*,std::allocator<Edge*>>::_M_push_back_aux<Edge*const&>
              ((deque<Edge*,std::allocator<Edge*>> *)&this->finished_,&local_8);
  }
  else {
    *ppEVar2 = edge;
    piVar1 = &(this->finished_).c.super__Deque_base<Edge_*,_std::allocator<Edge_*>_>._M_impl.
              super__Deque_impl_data._M_finish;
    piVar1->_M_cur = piVar1->_M_cur + 1;
  }
  return true;
}

Assistant:

bool DryRunCommandRunner::StartCommand(Edge* edge) {
  finished_.push(edge);
  return true;
}